

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint32_t farmhash32_cc(char *s,size_t len)

{
  int *piVar1;
  int *piVar2;
  uint *puVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  
  uVar7 = (uint)len;
  if (0x18 < len) {
    uVar5 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar7;
    uVar6 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar7 * -0x3361d2af;
    uVar6 = (uVar6 >> 0x13 | uVar6 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0xc)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar13 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
             uVar7 * -0x3361d2af;
    uVar7 = (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0x10)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar6 = (uVar6 >> 0x13 | uVar6 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (uVar13 >> 0x13 | uVar13 * 0x2000) * 5 + 0xe6546b64;
    uVar9 = (len - 1) / 0x14;
    do {
      piVar1 = (int *)((long)s + 4);
      uVar11 = uVar7 + *piVar1;
      uVar10 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar5 = uVar5 ^ uVar10;
      uVar6 = (*(int *)((long)s + 8) * 0x16a88000 |
              (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar6;
      piVar2 = (int *)((long)s + 0xc);
      puVar3 = (uint *)((long)s + 0x10);
      s = (char *)((long)s + 0x14);
      uVar5 = (*piVar2 * 0x16a88000 | (uint)(*piVar2 * -0x3361d2af) >> 0x11) * 0x1b873593 + *piVar1
              ^ (uVar5 >> 0x12 | uVar5 << 0xe) * 5 + 0xe6546b64;
      uVar7 = (uVar6 >> 0x12 | uVar6 * 0x4000) * 5 + 0xe6546b64 ^ *puVar3;
      uVar13 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8;
      uVar7 = (uVar13 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) * 5;
      uVar6 = ((uVar5 >> 0x13 | uVar5 << 0xd) + *puVar3) * 5 + 0xe6546b64;
      uVar5 = (uVar11 >> 0x13 | uVar11 * 0x2000) * -0x3361d2af + uVar10;
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8;
      uVar6 = uVar10 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    uVar5 = ((uVar6 >> 0xb) * 0x16a88000 | (uVar6 >> 0xb | uVar10 << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af + uVar5;
    uVar5 = (uVar5 >> 0x13 | uVar5 * 0x2000) * 5 + 0xe6546b64;
    iVar12 = (uVar5 >> 0x11 | uVar5 * 0x8000) +
             ((uVar7 >> 0xb) * 0x16a88000 | (uVar13 * 0xa00000 | uVar7 >> 0xb) * -0x3361d2af >> 0x11
             );
    uVar7 = (iVar12 * -0x3a55e000 | (uint)(iVar12 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar7 >> 0x11 | uVar7 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar5 = 0;
        uVar6 = 9;
      }
      else {
        uVar6 = 9;
        uVar5 = 0;
        sVar8 = 0;
        do {
          pcVar4 = s + sVar8;
          sVar8 = sVar8 + 1;
          uVar5 = uVar5 * -0x3361d2af + (int)*pcVar4;
          uVar6 = uVar6 ^ uVar5;
        } while (len != sVar8);
      }
      uVar6 = (uVar7 * 0x16a88000 | uVar7 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar6;
      uVar7 = uVar6 >> 0x13 | uVar6 << 0xd;
    }
    else {
      iVar12 = *(int *)(s + (len - 4)) + uVar7 * 5;
      uVar5 = *(int *)(s + (ulong)(uVar7 >> 3 & 1) * 4) + 9;
      uVar7 = ((*(int *)s + uVar7) * 0x16a88000 | (*(int *)s + uVar7) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar7 * 5;
      uVar7 = (iVar12 * 0x16a88000 | (uint)(iVar12 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
      uVar7 = uVar7 >> 0x13 | uVar7 << 0xd;
    }
    uVar7 = (uVar5 * 0x16a88000 | uVar5 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar7 * 5 + 0xe6546b64
    ;
    uVar7 = uVar7 >> 0x13 | uVar7 << 0xd;
  }
  else {
    uVar7 = (*(int *)(s + ((len >> 1) - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + ((len >> 1) - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar7;
    uVar7 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (*(int *)(s + (len >> 1)) * 0x16a88000 |
            (uint)(*(int *)(s + (len >> 1)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = uVar7 >> 0x13 | uVar7 << 0xd;
  }
  uVar7 = uVar7 * 5 + 0xe6546b64;
  uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
  uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
  return uVar7 >> 0x10 ^ uVar7;
}

Assistant:

uint32_t farmhash32_cc(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? farmhash32_cc_len_0_to_4(s, len) : farmhash32_cc_len_5_to_12(s, len)) :
        farmhash32_cc_len_13_to_24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = ror32(fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = ror32(fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = ror32(fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = ror32(fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = ror32(fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = ror32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = ror32(fetch32(s) * c1, 17) * c2;
    uint32_t a1 = fetch32(s + 4);
    uint32_t a2 = ror32(fetch32(s + 8) * c1, 17) * c2;
    uint32_t a3 = ror32(fetch32(s + 12) * c1, 17) * c2;
    uint32_t a4 = fetch32(s + 16);
    h ^= a0;
    h = ror32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = ror32(f, 19);
    f = f * c1;
    g += a2;
    g = ror32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = ror32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap32(g) * 5;
    h += a4 * 5;
    h = bswap32(h);
    f += a0;
    PERMUTE3(&f, &h, &g);
    s += 20;
  } while (--iters != 0);
  g = ror32(g, 11) * c1;
  g = ror32(g, 17) * c1;
  f = ror32(f, 11) * c1;
  f = ror32(f, 17) * c1;
  h = ror32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  h = ror32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  return h;
}